

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int allow_postencode_drop_rtc(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *cpi_00;
  long in_RDI;
  AV1_COMMON *cm;
  undefined1 local_11;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  iVar1 = is_one_pass_rt_params(cpi_00);
  local_11 = false;
  if ((((iVar1 != 0) && (local_11 = false, *(int *)(in_RDI + 0x423dc) == 1)) &&
      (local_11 = false, 0 < *(int *)(in_RDI + 0x423c4))) &&
     (local_11 = false, *(int *)(in_RDI + 0x60870) == 0)) {
    iVar1 = frame_is_intra_only((AV1_COMMON *)cpi_00);
    local_11 = false;
    if (iVar1 == 0) {
      local_11 = *(int *)(in_RDI + 0x9d330) == 0;
    }
  }
  return (int)local_11;
}

Assistant:

static inline int allow_postencode_drop_rtc(const AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  return is_one_pass_rt_params(cpi) && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
         cpi->oxcf.rc_cfg.drop_frames_water_mark > 0 &&
         !cpi->rc.rtc_external_ratectrl && !frame_is_intra_only(cm) &&
         cpi->svc.spatial_layer_id == 0;
}